

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool GlobOpt::DoArraySegmentHoist(ValueType baseValueType,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  JITTimeProfileInfo *this;
  ValueType local_22 [4];
  ValueType baseValueType_local;
  
  bVar2 = ValueType::IsLikelyAnyOptimizedArray(local_22);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3e59,"(baseValueType.IsLikelyAnyOptimizedArray())",
                       "baseValueType.IsLikelyAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = DoArrayCheckHoist(func);
  if (bVar2) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,ArraySegmentHoistPhase,uVar3,uVar4);
    if (!bVar2) {
      bVar2 = ValueType::IsLikelyArrayOrObjectWithArray(local_22);
      if (!bVar2) {
        return true;
      }
      pJVar6 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
      pFVar7 = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
      uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,JsArraySegmentHoistPhase,uVar3,uVar4);
      if (!bVar2) {
        pJVar6 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
        bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar6);
        if (!bVar2) {
          return true;
        }
        pJVar6 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
        this = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar6);
        bVar2 = JITTimeWorkItem::IsLoopBody(func->m_workItem);
        bVar2 = JITTimeProfileInfo::IsJsArraySegmentHoistDisabled(this,bVar2);
        return !bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoArraySegmentHoist(const ValueType baseValueType, Func const * const func)
{
    Assert(baseValueType.IsLikelyAnyOptimizedArray());

    if(!DoArrayCheckHoist(func) || PHASE_OFF(Js::ArraySegmentHoistPhase, func))
    {
        return false;
    }

    if(!baseValueType.IsLikelyArrayOrObjectWithArray())
    {
        return true;
    }

    return
        !PHASE_OFF(Js::JsArraySegmentHoistPhase, func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsJsArraySegmentHoistDisabled(func->IsLoopBody()));
}